

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall icu_63::Calendar::validateFields(Calendar *this,UErrorCode *status)

{
  int32_t field;
  ulong uVar1;
  
  for (uVar1 = 0; (*status < U_ILLEGAL_ARGUMENT_ERROR && (uVar1 < 0x17)); uVar1 = uVar1 + 1) {
    if (1 < this->fStamp[uVar1]) {
      (*(this->super_UObject)._vptr_UObject[0x27])(this,uVar1 & 0xffffffff,status);
    }
  }
  return;
}

Assistant:

void Calendar::validateFields(UErrorCode &status) {
    for (int32_t field = 0; U_SUCCESS(status) && (field < UCAL_FIELD_COUNT); field++) {
        if (fStamp[field] >= kMinimumUserStamp) {
            validateField((UCalendarDateFields)field, status);
        }
    }
}